

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O1

void soul::buildFunctions(ModuleBase *module,Module *m,StringDictionary *dictionary)

{
  long lVar1;
  SourceCodeText *o;
  long *plVar2;
  undefined8 uVar3;
  Ptr o_00;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  Function *extraout_RDX;
  Function *extraout_RDX_00;
  Function *f;
  VariableDeclaration *v;
  VariableDeclaration *v_00;
  long *plVar7;
  Variable param;
  CodeLocation openParen;
  CodeLocationRange nameWithGenerics;
  Function desc;
  undefined1 local_338 [16];
  undefined1 local_328 [72];
  pointer pSStack_2e0;
  pointer local_2d8;
  undefined1 local_2c8 [16];
  undefined1 auStack_2b8 [24];
  UTF8Reader local_2a0;
  Ptr PStack_298;
  UTF8Reader local_290;
  pointer pSStack_288;
  pointer local_280;
  pointer pSStack_278;
  _Alloc_hider local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  _Alloc_hider local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  bool local_210;
  SourceCodeText *local_208;
  char *local_200;
  vector<soul::SourceCodeModel::Function,_std::allocator<soul::SourceCodeModel::Function>_>
  *local_1f8;
  string *local_1f0;
  string *local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  long *local_1d0;
  long *local_1c8;
  string *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b0;
  CodeLocationRange local_1a8;
  string local_188;
  CodeLocation local_168;
  undefined1 local_158 [88];
  _Alloc_hider local_100;
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  string local_e0;
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  vector<soul::SourceCodeModel::Variable,_std::allocator<soul::SourceCodeModel::Variable>_> local_80
  ;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  long *plVar6;
  
  local_328._56_8_ = dictionary;
  iVar5 = (*(module->super_ASTObject)._vptr_ASTObject[0xc])();
  plVar6 = (long *)CONCAT44(extraout_var,iVar5);
  if (plVar6 != (long *)0x0) {
    plVar7 = (long *)*plVar6;
    local_1c8 = (long *)plVar6[1];
    if (plVar7 != local_1c8) {
      local_1d8 = &local_e0.field_2;
      local_1f0 = (string *)&local_c0;
      local_1e0 = &local_b0;
      local_1e8 = &m->fullyQualifiedName;
      local_1b0 = &local_240;
      local_1c0 = (string *)&local_230;
      local_1b8 = &local_220;
      local_1f8 = &m->functions;
      do {
        bVar4 = shouldShow((Function *)*plVar7);
        if (bVar4) {
          local_158[0] = false;
          local_158[1] = false;
          local_158[2] = false;
          local_158[3] = false;
          local_158._72_8_ = (pointer)0x0;
          local_158._80_8_ = (pointer)0x0;
          local_158._56_8_ = (char *)0x0;
          local_158._64_8_ = (pointer)0x0;
          local_158._40_8_ = (char *)0x0;
          local_158._48_8_ = (SourceCodeText *)0x0;
          local_158._24_8_ = (pointer)0x0;
          local_158._32_8_ = (SourceCodeText *)0x0;
          local_158._8_8_ = (pointer)0x0;
          local_158._16_8_ = (pointer)0x0;
          local_100._M_p = (pointer)&local_f0;
          local_f8 = 0;
          local_f0._M_local_buf[0] = '\0';
          local_e0._M_dataplus._M_p = (pointer)local_1d8;
          local_e0._M_string_length = 0;
          local_e0.field_2._M_local_buf[0] = '\0';
          local_c0._M_p = (pointer)local_1e0;
          local_b8 = 0;
          local_b0._M_local_buf[0] = '\0';
          local_a0._M_p = (pointer)&local_90;
          local_98 = 0;
          local_90._M_local_buf[0] = '\0';
          local_80.
          super__Vector_base<soul::SourceCodeModel::Variable,_std::allocator<soul::SourceCodeModel::Variable>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_80.
          super__Vector_base<soul::SourceCodeModel::Variable,_std::allocator<soul::SourceCodeModel::Variable>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_80.
          super__Vector_base<soul::SourceCodeModel::Variable,_std::allocator<soul::SourceCodeModel::Variable>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_68._M_buckets = &local_68._M_single_bucket;
          local_68._M_bucket_count = 1;
          local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_68._M_element_count = 0;
          local_68._M_rehash_policy._M_max_load_factor = 1.0;
          local_68._M_rehash_policy._M_next_resize = 0;
          local_68._M_single_bucket = (__node_base_ptr)0x0;
          getComment((Comment *)local_2c8,(Context *)(*plVar7 + 0x10));
          local_328._0_8_ = local_158._24_8_;
          local_338._8_8_ = local_158._16_8_;
          local_338._0_8_ = local_158._8_8_;
          local_158._0_4_ = local_2c8._0_4_;
          local_158._8_8_ = local_2c8._8_8_;
          local_158._16_8_ = auStack_2b8._0_8_;
          local_158._24_8_ = auStack_2b8._8_8_;
          local_2c8._8_8_ = (pointer)0x0;
          auStack_2b8._0_8_ = (pointer)0x0;
          auStack_2b8._8_8_ = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_338);
          uVar3 = local_158._32_8_;
          if (auStack_2b8._16_8_ != local_158._32_8_) {
            local_158._32_8_ = auStack_2b8._16_8_;
            auStack_2b8._16_8_ = (SourceCodeText *)0x0;
            RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)uVar3);
          }
          uVar3 = local_158._48_8_;
          local_158._40_8_ = local_2a0.data;
          if (PStack_298.object != (SourceCodeText *)local_158._48_8_) {
            local_158._48_8_ = PStack_298.object;
            PStack_298.object = (SourceCodeText *)0x0;
            RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)uVar3);
          }
          local_158._56_8_ = local_290.data;
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(PStack_298.object);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)auStack_2b8._16_8_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_2c8 + 8));
          if (*(long *)(*plVar7 + 0x38) == 0) {
            throwInternalCompilerError("isValid()","toString",0x23);
          }
          std::__cxx11::string::_M_assign((string *)&local_e0);
          TokenisedPathString::join((string *)local_2c8,local_1e8,&local_e0);
          std::__cxx11::string::operator=((string *)&local_a0,(string *)local_2c8);
          f = extraout_RDX;
          if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
            operator_delete((void *)local_2c8._0_8_,(ulong)(auStack_2b8._0_8_ + 1));
            f = extraout_RDX_00;
          }
          makeUID_abi_cxx11_((string *)local_2c8,(soul *)*plVar7,f);
          std::__cxx11::string::operator=((string *)&local_100,(string *)local_2c8);
          if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
            operator_delete((void *)local_2c8._0_8_,(ulong)(auStack_2b8._0_8_ + 1));
          }
          lVar1 = *plVar7;
          o = *(SourceCodeText **)(lVar1 + 0x40);
          if (o != (SourceCodeText *)0x0) {
            (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
          }
          local_168.location.data = *(char **)(lVar1 + 0x48);
          local_168.sourceCode.object = o;
          SourceCodeUtilities::findNextOccurrence((SourceCodeUtilities *)&local_208,&local_168,'(');
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
          if ((local_208 == (SourceCodeText *)0x0) || ((local_208->content)._M_string_length == 0))
          {
            throwInternalCompilerError("! openParen.isEmpty()","buildFunctions",0x182);
          }
          lVar1 = *plVar7;
          local_1a8.start.sourceCode.object = *(SourceCodeText **)(lVar1 + 0x40);
          if (local_1a8.start.sourceCode.object != (SourceCodeText *)0x0) {
            ((local_1a8.start.sourceCode.object)->super_RefCountedObject).refCount =
                 ((local_1a8.start.sourceCode.object)->super_RefCountedObject).refCount + 1;
          }
          local_1a8.start.location.data = *(char **)(lVar1 + 0x48);
          local_1a8.end.sourceCode.object = local_208;
          if (local_208 != (SourceCodeText *)0x0) {
            (local_208->super_RefCountedObject).refCount =
                 (local_208->super_RefCountedObject).refCount + 1;
          }
          local_1a8.end.location.data = local_200;
          CodeLocationRange::toString_abi_cxx11_(&local_188,&local_1a8);
          simplifyWhitespace((string *)local_2c8,&local_188);
          std::__cxx11::string::operator=(local_1f0,(string *)local_2c8);
          if ((pointer)local_2c8._0_8_ != (pointer)(local_2c8 + 0x10)) {
            operator_delete((void *)local_2c8._0_8_,(ulong)(auStack_2b8._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if (*(Expression **)(*plVar7 + 0x30) != (Expression *)0x0) {
            ExpressionHelpers::create
                      ((Expression *)local_338,*(Expression **)(*plVar7 + 0x30),
                       (StringDictionary *)local_328._56_8_);
            auStack_2b8._0_8_ = local_158._80_8_;
            local_2c8._8_8_ = local_158._72_8_;
            local_2c8._0_8_ = local_158._64_8_;
            local_158._64_8_ = local_338._0_8_;
            local_158._72_8_ = local_338._8_8_;
            local_158._80_8_ = local_328._0_8_;
            local_338._0_8_ = (pointer)0x0;
            local_338._8_8_ = (pointer)0x0;
            local_328._0_8_ = (pointer)0x0;
            std::
            vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                       *)local_2c8);
            std::
            vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                       *)local_338);
          }
          plVar2 = *(long **)(*plVar7 + 0x60);
          local_1d0 = plVar7;
          for (plVar6 = *(long **)(*plVar7 + 0x58); plVar7 = local_1d0, plVar6 != plVar2;
              plVar6 = plVar6 + 1) {
            local_2c8._0_8_ = local_2c8._0_8_ & 0xffffffff00000000;
            local_280 = (pointer)0x0;
            pSStack_278 = (pointer)0x0;
            local_290.data = (char *)0x0;
            pSStack_288 = (pointer)0x0;
            local_2a0.data = (char *)0x0;
            PStack_298.object = (SourceCodeText *)0x0;
            auStack_2b8._8_8_ = (pointer)0x0;
            auStack_2b8._16_8_ = (SourceCodeText *)0x0;
            local_2c8._8_8_ = (pointer)0x0;
            auStack_2b8._0_8_ = (pointer)0x0;
            local_270._M_p = (pointer)&local_260;
            local_268 = 0;
            local_260._M_local_buf[0] = '\0';
            local_250._M_p = (pointer)local_1b0;
            local_248 = 0;
            local_240._M_local_buf[0] = '\0';
            local_230._M_p = (pointer)local_1b8;
            local_228 = 0;
            local_220._M_local_buf[0] = '\0';
            local_210 = false;
            getComment((Comment *)local_338,(Context *)(*plVar6 + 0x10));
            local_2d8 = (pointer)auStack_2b8._8_8_;
            pSStack_2e0 = (pointer)auStack_2b8._0_8_;
            local_328._64_8_ = local_2c8._8_8_;
            local_2c8._0_4_ = local_338._0_4_;
            local_2c8._8_8_ = local_338._8_8_;
            auStack_2b8._0_8_ = local_328._0_8_;
            auStack_2b8._8_8_ = local_328._8_8_;
            local_338._8_8_ = (pointer)0x0;
            local_328._0_8_ = (pointer)0x0;
            local_328._8_8_ = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_328 + 0x40));
            uVar3 = auStack_2b8._16_8_;
            if (local_328._16_8_ != auStack_2b8._16_8_) {
              auStack_2b8._16_8_ = local_328._16_8_;
              local_328._16_8_ = (SourceCodeText *)0x0;
              RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)uVar3);
            }
            o_00.object = PStack_298.object;
            local_2a0.data = (char *)local_328._24_8_;
            if ((SourceCodeText *)local_328._32_8_ != PStack_298.object) {
              PStack_298.object = (SourceCodeText *)local_328._32_8_;
              local_328._32_8_ = (SourceCodeText *)0x0;
              RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o_00.object);
            }
            local_290.data = (char *)local_328._40_8_;
            RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_328._32_8_);
            RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_328._16_8_);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_338 + 8));
            if (*(long *)(*plVar6 + 0x28) == 0) {
              throwInternalCompilerError("isValid()","toString",0x23);
            }
            std::__cxx11::string::_M_assign((string *)&local_250);
            makeUID_abi_cxx11_((string *)local_338,(soul *)*plVar6,v);
            std::__cxx11::string::operator=((string *)&local_270,(string *)local_338);
            if ((pointer)local_338._0_8_ != (pointer)local_328) {
              operator_delete((void *)local_338._0_8_,(ulong)(local_328._0_8_ + 1));
            }
            ExpressionHelpers::forVariable
                      ((Expression *)(local_328 + 0x40),(VariableDeclaration *)*plVar6,
                       (StringDictionary *)local_328._56_8_);
            local_328._0_8_ = pSStack_278;
            local_338._8_8_ = local_280;
            local_338._0_8_ = pSStack_288;
            pSStack_288 = (pointer)local_328._64_8_;
            local_280 = pSStack_2e0;
            pSStack_278 = local_2d8;
            local_328._64_8_ = 0;
            pSStack_2e0 = (pointer)0x0;
            local_2d8 = (pointer)0x0;
            std::
            vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                       *)local_338);
            std::
            vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
            ::~vector((vector<soul::SourceCodeModel::Expression::Section,_std::allocator<soul::SourceCodeModel::Expression::Section>_>
                       *)(local_328 + 0x40));
            getInitialiserValue_abi_cxx11_((string *)local_338,(soul *)*plVar6,v_00);
            std::__cxx11::string::operator=(local_1c0,(string *)local_338);
            if ((pointer)local_338._0_8_ != (pointer)local_328) {
              operator_delete((void *)local_338._0_8_,(ulong)(local_328._0_8_ + 1));
            }
            std::
            vector<soul::SourceCodeModel::Variable,_std::allocator<soul::SourceCodeModel::Variable>_>
            ::emplace_back<soul::SourceCodeModel::Variable>(&local_80,(Variable *)local_2c8);
            SourceCodeModel::Variable::~Variable((Variable *)local_2c8);
          }
          createAnnotation((Annotation *)local_2c8,(Annotation *)(*local_1d0 + 0xb0),
                           (StringDictionary *)local_328._56_8_);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_M_move_assign(&local_68,
                           (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)local_2c8);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_soul::SourceCodeModel::Expression>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_2c8);
          std::
          vector<soul::SourceCodeModel::Function,_std::allocator<soul::SourceCodeModel::Function>_>
          ::emplace_back<soul::SourceCodeModel::Function>(local_1f8,(Function *)local_158);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_1a8.end.sourceCode.object);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_1a8.start.sourceCode.object);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_208);
          SourceCodeModel::Function::~Function((Function *)local_158);
        }
        plVar7 = plVar7 + 1;
      } while (plVar7 != local_1c8);
    }
  }
  return;
}

Assistant:

static void buildFunctions (AST::ModuleBase& module, SourceCodeModel::Module& m, const StringDictionary& dictionary)
{
    if (auto functions = module.getFunctionList())
    {
        for (auto& f : *functions)
        {
            if (shouldShow (f))
            {
                SourceCodeModel::Function desc;
                desc.comment = getComment (f->context);
                desc.bareName = f->name.toString();
                desc.fullyQualifiedName = TokenisedPathString::join (m.fullyQualifiedName, desc.bareName);
                desc.UID = makeUID (f);

                auto openParen = SourceCodeUtilities::findNextOccurrence (f->nameLocation.location, '(');
                SOUL_ASSERT (! openParen.isEmpty());

                CodeLocationRange nameWithGenerics { f->nameLocation.location, openParen };
                desc.nameWithGenerics = simplifyWhitespace (nameWithGenerics.toString());

                if (auto ret = f->returnType.get())
                    desc.returnType = ExpressionHelpers::create (*ret, dictionary);

                for (auto& p : f->parameters)
                {
                    SourceCodeModel::Variable param;
                    param.comment = getComment (p->context);
                    param.name = p->name.toString();
                    param.UID = makeUID (p);
                    param.type = ExpressionHelpers::forVariable (p, dictionary);
                    param.initialiser = getInitialiserValue (p);

                    desc.parameters.push_back (std::move (param));
                }

                desc.annotation = createAnnotation (f->annotation, dictionary);

                m.functions.push_back (std::move (desc));
            }
        }
    }
}